

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O1

void asm_bitshift(ASMState *as,IRIns *ir,x86Shift xs,x86Op xv)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  IRIns *pIVar4;
  char cVar5;
  Reg rr;
  Reg rb;
  Reg RVar6;
  MCode *pMVar7;
  MCode MVar8;
  byte bVar10;
  uint uVar9;
  x86Op xo;
  uint uVar11;
  ulong uVar12;
  MCode MVar13;
  uint uVar14;
  bool bVar15;
  
  uVar1 = (ir->field_0).op2;
  uVar12 = (ulong)uVar1;
  pIVar4 = as->ir;
  cVar5 = (char)xs;
  if ((short)uVar1 < 0) {
    if ((xv != XOg_FADDq) && ((as->flags & 0x40) != 0)) {
      rr = ra_dest(as,ir,0xbfef);
      bVar10 = *(byte *)((long)as->ir + uVar12 * 8 + 6);
      RVar6 = (Reg)bVar10;
      if ((char)bVar10 < '\0') {
        RVar6 = ra_allocref(as,(uint)uVar1,0xbfef);
      }
      bVar10 = (byte)RVar6 & 0x1f;
      as->weakset = as->weakset & (-2 << bVar10 | 0xfffffffeU >> 0x20 - bVar10);
      uVar11._0_2_ = *(IROpT *)((long)ir + 4);
      uVar11._2_2_ = *(IRRef1 *)((long)ir + 6);
      rb = asm_fuseloadm(as,(uint)(ir->field_0).op1,~(1 << (RVar6 & 0x1f)) & 0xbfef,
                         (uint)((0x605fd9U >> (uVar11 & 0x1f) & 1) != 0));
      xo = RVar6 << 0x13 ^ (0x605fd9U >> ((ir->field_1).t.irt & 0x1f) & 1) * 0x800000 + xv;
LAB_0013df2f:
      emit_mrm(as,xo,rr,rb);
      return;
    }
    rr = ra_dest(as,ir,0xbfed);
    if (rr == 1) {
      rr = ra_scratch(as,0xbfed);
      uVar9._0_2_ = *(IROpT *)((long)ir + 4);
      uVar9._2_2_ = *(IRRef1 *)((long)ir + 6);
      bVar15 = (0x605fd9U >> (uVar9 & 0x1f) & 1) == 0;
      bVar10 = 8;
      if (bVar15) {
        bVar10 = 0;
      }
      pMVar7 = as->mcp;
      pMVar7[-1] = (byte)rr & 7 | 200;
      pMVar7[-2] = 0x8b;
      uVar9 = rr >> 3 & 1;
      if (bVar15 && uVar9 == 0) {
        pMVar7 = pMVar7 + -2;
      }
      else {
        pMVar7[-3] = bVar10 | (byte)uVar9 | 0x40;
        pMVar7 = pMVar7 + -3;
      }
      as->mcp = pMVar7;
    }
    bVar10 = *(byte *)((long)pIVar4 + uVar12 * 8 + 6);
    if ((char)bVar10 < '\0') {
      uVar9 = ra_allocref(as,(uint)uVar1,2);
    }
    else {
      uVar9 = 1;
      if (bVar10 != 1) {
        ra_scratch(as,2);
        uVar9 = (uint)bVar10;
      }
    }
    uVar14._0_2_ = *(IROpT *)((long)ir + 4);
    uVar14._2_2_ = *(IRRef1 *)((long)ir + 6);
    uVar14 = (-(uint)((0x605fd9U >> (uVar14 & 0x1f) & 1) != 0) & 0x80200) + xs;
    pMVar7 = as->mcp;
    pMVar7[-1] = ((byte)rr & 7) + cVar5 * '\b' | 0xc0;
    pMVar7[-2] = 0xd3;
    uVar11 = rr >> 3 & 1 | uVar14 >> 1 & 0x104;
    if (uVar11 == 0) {
      pMVar7 = pMVar7 + -2;
    }
    else {
      pMVar7[-3] = (byte)uVar11 | (byte)(uVar14 >> 0x10) | 0x40;
      pMVar7 = pMVar7 + -3;
    }
    as->mcp = pMVar7;
    bVar10 = (byte)uVar9 & 0x1f;
    as->weakset = as->weakset & (-2 << bVar10 | 0xfffffffeU >> 0x20 - bVar10);
    if (uVar9 == 1) goto LAB_0013e035;
    pMVar7[-1] = (byte)uVar9 & 7 | 200;
    pMVar7[-2] = 0x8b;
    if ((uVar9 & 8) == 0) goto LAB_0013e02a;
    pMVar7[-3] = 'A';
LAB_0013dee4:
    pMVar7 = pMVar7 + -3;
  }
  else {
    rr = ra_dest(as,ir,0xbfef);
    uVar2._0_2_ = *(IROpT *)((long)ir + 4);
    uVar2._2_2_ = *(IRRef1 *)((long)ir + 6);
    uVar9 = (uint)((0x605fd9U >> (uVar2 & 0x1f) & 1) != 0);
    uVar14 = (uVar9 << 5 | 0x1f) & pIVar4[uVar12].field_1.op12;
    MVar13 = (MCode)uVar14;
    if (((xv == XOg_FADDq) && (uVar14 != 0)) && ((as->flags & 0x40) != 0)) {
      rb = asm_fuseloadm(as,(uint)(ir->field_0).op1,0xbfef,uVar9);
      if (rb != rr) {
        MVar8 = -MVar13;
        if (xs != XOg_ROL) {
          MVar8 = MVar13;
        }
        pMVar7 = as->mcp;
        as->mcp = pMVar7 + -1;
        pMVar7[-1] = MVar8;
        xo = (0x605fd9U >> ((ir->field_1).t.irt & 0x1f) & 1) << 0x17 | XV_RORX;
        goto LAB_0013df2f;
      }
    }
    if (uVar14 == 0) goto LAB_0013e035;
    if (uVar14 == 1) {
      uVar3._0_2_ = *(IROpT *)((long)ir + 4);
      uVar3._2_2_ = *(IRRef1 *)((long)ir + 6);
      pMVar7 = as->mcp;
      pMVar7[-1] = ((byte)rr & 7) + cVar5 * '\b' | 0xc0;
      pMVar7[-2] = 0xd1;
    }
    else {
      pMVar7 = as->mcp;
      as->mcp = pMVar7 + -1;
      pMVar7[-1] = MVar13;
      uVar3._0_2_ = *(IROpT *)((long)ir + 4);
      uVar3._2_2_ = *(IRRef1 *)((long)ir + 6);
      pMVar7 = as->mcp;
      pMVar7[-1] = ((byte)rr & 7) + cVar5 * '\b' | 0xc0;
      pMVar7[-2] = 0xc1;
    }
    uVar9 = (-(uint)((0x605fd9U >> (uVar3 & 0x1f) & 1) != 0) & 0x80200) + xs;
    uVar14 = rr >> 3 & 1 | uVar9 >> 1 & 0x104;
    if (uVar14 != 0) {
      pMVar7[-3] = (byte)uVar14 | (byte)(uVar9 >> 0x10) | 0x40;
      goto LAB_0013dee4;
    }
LAB_0013e02a:
    pMVar7 = pMVar7 + -2;
  }
  as->mcp = pMVar7;
LAB_0013e035:
  ra_left(as,rr,(uint)(ir->field_0).op1);
  return;
}

Assistant:

static void asm_bitshift(ASMState *as, IRIns *ir, x86Shift xs, x86Op xv)
{
  IRRef rref = ir->op2;
  IRIns *irr = IR(rref);
  Reg dest;
  if (irref_isk(rref)) {  /* Constant shifts. */
    int shift;
    dest = ra_dest(as, ir, RSET_GPR);
    shift = irr->i & (irt_is64(ir->t) ? 63 : 31);
    if (!xv && shift && (as->flags & JIT_F_BMI2)) {
      Reg left = asm_fuseloadm(as, ir->op1, RSET_GPR, irt_is64(ir->t));
      if (left != dest) {  /* BMI2 rotate right by constant. */
	emit_i8(as, xs == XOg_ROL ? -shift : shift);
	emit_mrm(as, VEX_64IR(ir, XV_RORX), dest, left);
	return;
      }
    }
    switch (shift) {
    case 0: break;
    case 1: emit_rr(as, XO_SHIFT1, REX_64IR(ir, xs), dest); break;
    default: emit_shifti(as, REX_64IR(ir, xs), dest, shift); break;
    }
  } else if ((as->flags & JIT_F_BMI2) && xv) {	/* BMI2 variable shifts. */
    Reg left, right;
    dest = ra_dest(as, ir, RSET_GPR);
    right = ra_alloc1(as, rref, RSET_GPR);
    left = asm_fuseloadm(as, ir->op1, rset_exclude(RSET_GPR, right),
			 irt_is64(ir->t));
    emit_mrm(as, VEX_64IR(ir, xv) ^ (right << 19), dest, left);
    return;
  } else {  /* Variable shifts implicitly use register cl (i.e. ecx). */
    Reg right;
    dest = ra_dest(as, ir, rset_exclude(RSET_GPR, RID_ECX));
    if (dest == RID_ECX) {
      dest = ra_scratch(as, rset_exclude(RSET_GPR, RID_ECX));
      emit_rr(as, XO_MOV, REX_64IR(ir, RID_ECX), dest);
    }
    right = irr->r;
    if (ra_noreg(right))
      right = ra_allocref(as, rref, RID2RSET(RID_ECX));
    else if (right != RID_ECX)
      ra_scratch(as, RID2RSET(RID_ECX));
    emit_rr(as, XO_SHIFTcl, REX_64IR(ir, xs), dest);
    ra_noweak(as, right);
    if (right != RID_ECX)
      emit_rr(as, XO_MOV, RID_ECX, right);
  }
  ra_left(as, dest, ir->op1);
  /*
  ** Note: avoid using the flags resulting from a shift or rotate!
  ** All of them cause a partial flag stall, except for r,1 shifts
  ** (but not rotates). And a shift count of 0 leaves the flags unmodified.
  */
}